

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texture2.c
# Opt level: O2

ktx_size_t ktxTexture2_GetDataSizeUncompressed(ktxTexture2 *This)

{
  ktxTexture2_private *pkVar1;
  ktx_uint32_t kVar2;
  long lVar3;
  ktx_size_t kVar4;
  uint uVar5;
  undefined1 in_XMM1 [16];
  undefined1 auVar6 [16];
  
  if (This->supercompressionScheme - KTX_SS_ZSTD < 2) {
    pkVar1 = This->_private;
    kVar2 = ktxTexture2_calcPostInflationLevelAlignment(This);
    uVar5 = This->numLevels;
    lVar3 = 0;
    while (uVar5 = uVar5 - 1, 0 < (int)uVar5) {
      auVar6._4_12_ = in_XMM1._4_12_;
      auVar6._0_4_ = (float)pkVar1->_levelIndex[uVar5 & 0x7fffffff].uncompressedByteLength /
                     (float)kVar2;
      auVar6 = roundss(auVar6,auVar6,10);
      in_XMM1._4_12_ = auVar6._4_12_;
      in_XMM1._0_4_ = auVar6._0_4_ * (float)kVar2;
      lVar3 = lVar3 + ((long)in_XMM1._0_4_ & 0xffffffffU);
    }
    kVar4 = lVar3 + pkVar1->_levelIndex[0].uncompressedByteLength;
  }
  else if (This->supercompressionScheme < KTX_SS_ZSTD) {
    kVar4 = This->dataSize;
  }
  else {
    kVar4 = 0;
  }
  return kVar4;
}

Assistant:

ktx_size_t
ktxTexture2_GetDataSizeUncompressed(ktxTexture2* This)
{
    switch (This->supercompressionScheme) {
      case KTX_SS_BASIS_LZ:
      case KTX_SS_NONE:
        return This->dataSize;
      case KTX_SS_ZSTD:
      case KTX_SS_ZLIB:
      {
            ktx_size_t uncompressedSize = 0;
            ktx_uint32_t uncompressedLevelAlignment;
            ktxLevelIndexEntry* levelIndex = This->_private->_levelIndex;

            uncompressedLevelAlignment =
                ktxTexture2_calcPostInflationLevelAlignment(This);

            for (ktx_int32_t level = This->numLevels - 1; level >= 1; level--) {
                ktx_size_t uncompressedLevelSize;
                uncompressedLevelSize = levelIndex[level].uncompressedByteLength;
                uncompressedLevelSize = _KTX_PADN(uncompressedLevelAlignment,
                                                  uncompressedLevelSize);
                uncompressedSize += uncompressedLevelSize;
            }
            uncompressedSize += levelIndex[0].uncompressedByteLength;
            return uncompressedSize;
      }
      case KTX_SS_BEGIN_VENDOR_RANGE:
      case KTX_SS_END_VENDOR_RANGE:
      case KTX_SS_BEGIN_RESERVED:
      default:
        return 0;
    }
}